

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ProgramOptions::run(ProgramOptions *this)

{
  ulong uVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostream *this_00;
  void *this_01;
  ostream *in_RDI;
  double dVar4;
  ofstream result_out;
  ofstream points_out;
  KrazyMeans km;
  shared_ptr<DataSet> ds;
  Timer t;
  undefined6 in_stack_fffffffffffffaa0;
  byte in_stack_fffffffffffffaa6;
  byte in_stack_fffffffffffffaa7;
  undefined8 in_stack_fffffffffffffab8;
  undefined1 quiet;
  KrazyMeans *in_stack_fffffffffffffac0;
  ProgramOptions *in_stack_fffffffffffffaf0;
  float scale_factor;
  KrazyMeans *this_02;
  KrazyMeans *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffcc8;
  KrazyMeans *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffd28;
  undefined1 local_2b0 [512];
  string local_b0 [116];
  uint local_3c;
  
  quiet = (undefined1)((ulong)in_stack_fffffffffffffab8 >> 0x38);
  if (((byte)in_RDI[0x41] & 1) != 0) {
    generateBenchmark(in_stack_fffffffffffffaf0);
  }
  if (((byte)in_RDI[0x40] & 1) != 0) {
    generateExample(in_stack_fffffffffffffaf0);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_02 = (KrazyMeans *)&stack0xffffffffffffffe8;
    Timer::Timer((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                   CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                   CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    DataSet::fromFile(in_stack_fffffffffffffd28);
    Timer::stop((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                  CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    poVar2 = std::operator<<((ostream *)&std::cout,"Loading dataset           : ");
    dVar4 = Timer::seconds((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                             CONCAT16(in_stack_fffffffffffffaa6,
                                                      in_stack_fffffffffffffaa0)));
    poVar3 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    this_00 = std::operator<<(poVar3," s.");
    scale_factor = (float)((ulong)poVar3 >> 0x20);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    KrazyMeans::KrazyMeans
              (this_02,(shared_ptr<DataSet> *)poVar2,(uint)((ulong)dVar4 >> 0x20),SUB84(dVar4,0),
               scale_factor);
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                   CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    KrazyMeans::initialize
              ((KrazyMeans *)
               CONCAT17(in_stack_fffffffffffffaa7,
                        CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    Timer::stop((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                  CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    poVar2 = std::operator<<((ostream *)&std::cout,"Algorithm initialization  : ");
    dVar4 = Timer::seconds((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                             CONCAT16(in_stack_fffffffffffffaa6,
                                                      in_stack_fffffffffffffaa0)));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = std::operator<<(poVar2," s.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                   CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    KrazyMeans::run(in_stack_fffffffffffffac0,(bool)quiet);
    Timer::stop((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                  CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    poVar2 = std::operator<<((ostream *)&std::cout,"Reached convergence after : ");
    dVar4 = Timer::seconds((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                             CONCAT16(in_stack_fffffffffffffaa6,
                                                      in_stack_fffffffffffffaa0)));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = std::operator<<(poVar2," s.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Iterations                : ");
    this_01 = (void *)std::ostream::operator<<(poVar2,local_3c);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                     CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)))
      ;
      std::__cxx11::string::string(local_b0,(string *)(in_RDI + 0x20));
      KrazyMeans::dumpLabels(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      std::__cxx11::string::~string(local_b0);
      Timer::stop((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                    CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
      poVar2 = std::operator<<((ostream *)&std::cout,"Writing result            : ");
      dVar4 = Timer::seconds((Timer *)CONCAT17(in_stack_fffffffffffffaa7,
                                               CONCAT16(in_stack_fffffffffffffaa6,
                                                        in_stack_fffffffffffffaa0)));
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
      poVar2 = std::operator<<(poVar2," s.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"No output file was specified.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    if (((byte)in_RDI[0x42] & 1) != 0) {
      std::ofstream::ofstream(local_2b0,"points.csv",_S_out);
      std::ofstream::ofstream(&stack0xfffffffffffffb50,"centroids.csv",_S_out);
      in_stack_fffffffffffffaa7 = std::ios::good();
      if (((in_stack_fffffffffffffaa7 & 1) == 0) ||
         (in_stack_fffffffffffffaa6 = std::ios::good(), (in_stack_fffffffffffffaa6 & 1) == 0)) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Could not create CSV output files.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        KrazyMeans::printState(in_stack_fffffffffffffb50,in_RDI,(ostream *)this_02);
      }
      std::ofstream::~ofstream(&stack0xfffffffffffffb50);
      std::ofstream::~ofstream(local_2b0);
    }
    KrazyMeans::~KrazyMeans
              ((KrazyMeans *)
               CONCAT17(in_stack_fffffffffffffaa7,
                        CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    std::shared_ptr<DataSet>::~shared_ptr((shared_ptr<DataSet> *)0x1040d0);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"No input file was specified.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void run() {
    if (generate_benchmark) generateBenchmark();
    if (generate_example) generateExample();

    if (!input_file.empty()) {
      Timer t;

      // Load data
      t.start();
      auto ds = DataSet::fromFile(input_file);
      t.stop();
      std::cout << "Loading dataset           : " << t.seconds() << " s." << std::endl;

      // Create KM context
      auto km = KrazyMeans(ds, clusters, threshold_iters, scaling_factor);

      // Initialize algorithm
      t.start();
      km.initialize();
      t.stop();
      std::cout << "Algorithm initialization  : " << t.seconds() << " s." << std::endl;

      // Run algorithm
      t.start();
      km.run(false);
      t.stop();
      std::cout << "Reached convergence after : " << t.seconds() << " s." << std::endl;
      std::cout << "Iterations                : " << km.iteration << std::endl;

      // Write labels to file
      if (!output_file.empty()) {
        t.start();
        km.dumpLabels(output_file);
        t.stop();
        std::cout << "Writing result            : " << t.seconds() << " s." << std::endl;
      } else {
        std::cerr << "No output file was specified." << std::endl;
      }

      if (plot_outputs) {
        std::ofstream points_out("points.csv");
        std::ofstream result_out("centroids.csv");

        if (points_out.good() && result_out.good()) {
          km.printState(points_out, result_out);
        } else {
          std::cerr << "Could not create CSV output files." << std::endl;
        }
      }
    } else {
      std::cerr << "No input file was specified." << std::endl;
    }
  }